

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

int semver::detail::compare(string_view lhs,string_view rhs)

{
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_str = lhs._M_str;
  local_10._M_len = lhs._M_len;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_10,rhs);
  return iVar1;
}

Assistant:

SEMVER_CONSTEXPR int compare(std::string_view lhs, std::string_view rhs) {
#if defined(_MSC_VER) && _MSC_VER < 1920 && !defined(__clang__)
  // https://developercommunity.visualstudio.com/content/problem/360432/vs20178-regression-c-failed-in-test.html
  // https://developercommunity.visualstudio.com/content/problem/232218/c-SEMVER_CONSTEXPR-string-view.html
  constexpr bool workaround = true;
#else
  constexpr bool workaround = false;
#endif

  if constexpr (workaround) {
    const auto size = std::min(lhs.size(), rhs.size());
    for (std::size_t i = 0; i < size; ++i) {
      if (lhs[i] < rhs[i]) {
        return -1;
      } else if (lhs[i] > rhs[i]) {
        return 1;
      }
    }

    return static_cast<int>(lhs.size() - rhs.size());
  } else {
    return lhs.compare(rhs);
  }
}